

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
MDIOSimulationDataGenerator::CreateBit(MDIOSimulationDataGenerator *this,BitState bit_state)

{
  int iVar1;
  BitState bit_state_local;
  MDIOSimulationDataGenerator *this_local;
  
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMdio);
  iVar1 = (int)this;
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  return;
}

Assistant:

void MDIOSimulationDataGenerator::CreateBit( BitState bit_state )
{
    mMdio->TransitionIfNeeded( bit_state );
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
    mMdc->Transition(); // MDC posedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
    mMdc->Transition(); // MDC negedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
}